

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_9::DiskAppendableFile::~DiskAppendableFile(DiskAppendableFile *this)

{
  DiskAppendableFile *this_local;
  
  ~DiskAppendableFile(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

DiskAppendableFile(OwnFd&& fd)
      : DiskHandle(kj::mv(fd)),
        FdOutputStream(DiskHandle::fd.get()) {}